

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SetLineBlocking(FParser *this)

{
  bool bVar1;
  int iVar2;
  int i;
  FLineIdIterator itr;
  int tag;
  int blocking;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (((bVar1) && (iVar2 = intvalue(this->t_argv + 1), -1 < iVar2)) && (iVar2 < 3)) {
    itr.start = (int)SF_SetLineBlocking::blocks[iVar2];
    itr.searchtag = intvalue(this->t_argv);
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffe0,itr.searchtag);
    while (iVar2 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffe0), -1 < iVar2) {
      lines[iVar2].flags = lines[iVar2].flags & 0xffff7ffe | itr.start;
    }
  }
  return;
}

Assistant:

void FParser::SF_SetLineBlocking(void)
{
	static unsigned short blocks[]={0,ML_BLOCKING,ML_BLOCKEVERYTHING};
	
	if (CheckArgs(2))
	{
		int blocking=intvalue(t_argv[1]);
		if (blocking>=0 && blocking<=2) 
		{
			blocking=blocks[blocking];
			int tag=intvalue(t_argv[0]);
			FLineIdIterator itr(tag);
			int i;
			while ((i = itr.Next()) >= 0)
			{
				lines[i].flags = (lines[i].flags & ~(ML_BLOCKING | ML_BLOCKEVERYTHING)) | blocking;
			}
		}
	}
}